

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,char *str)

{
  size_t sVar1;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,str,sVar1);
    return;
  }
  std::ios::clear((int)this +
                  (int)(this->stream).super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream[-3]);
  return;
}

Assistant:

void StreamState::append(const char *str)
{
	stream << str;
}